

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O3

int bip32_key_unserialize(uchar *bytes,size_t bytes_len,ext_key *key_out)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  
  if ((key_out == (ext_key *)0x0 || bytes == (uchar *)0x0) || bytes_len != 0x4e) {
    return -2;
  }
  wally_clear(key_out,0xc0);
  uVar5 = *(uint *)bytes;
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  key_out->version = uVar5;
  if ((int)uVar5 < 0x488ade4) {
    if ((uVar5 != 0x4358394) && (uVar5 != 0x43587cf)) goto LAB_0049df74;
  }
  else if ((uVar5 != 0x488ade4) && (uVar5 != 0x488b21e)) goto LAB_0049df74;
  key_out->depth = bytes[4];
  *(undefined4 *)key_out->parent160 = *(undefined4 *)(bytes + 5);
  uVar1 = *(uint *)(bytes + 9);
  key_out->child_num =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar2 = *(undefined8 *)(bytes + 0xd);
  uVar3 = *(undefined8 *)(bytes + 0x15);
  uVar4 = *(undefined8 *)(bytes + 0x25);
  *(undefined8 *)(key_out->chain_code + 0x10) = *(undefined8 *)(bytes + 0x1d);
  *(undefined8 *)(key_out->chain_code + 0x18) = uVar4;
  *(undefined8 *)key_out->chain_code = uVar2;
  *(undefined8 *)(key_out->chain_code + 8) = uVar3;
  if (bytes[0x2d] == '\0') {
    if ((uVar5 != 0x488b21e) && (uVar5 != 0x43587cf)) {
      key_out->priv_key[0x20] = bytes[0x4d];
      uVar2 = *(undefined8 *)(bytes + 0x2d);
      uVar3 = *(undefined8 *)(bytes + 0x35);
      uVar4 = *(undefined8 *)(bytes + 0x45);
      *(undefined8 *)(key_out->priv_key + 0x10) = *(undefined8 *)(bytes + 0x3d);
      *(undefined8 *)(key_out->priv_key + 0x18) = uVar4;
      *(undefined8 *)key_out->priv_key = uVar2;
      *(undefined8 *)(key_out->priv_key + 8) = uVar3;
      iVar6 = wally_ec_public_key_from_private_key(key_out->priv_key + 1,0x20,key_out->pub_key,0x21)
      ;
      if (iVar6 == 0) goto LAB_0049df18;
    }
  }
  else if ((uVar5 != 0x488ade4) && (uVar5 != 0x4358394)) {
    key_out->pub_key[0x20] = bytes[0x4d];
    uVar2 = *(undefined8 *)(bytes + 0x2d);
    uVar3 = *(undefined8 *)(bytes + 0x35);
    uVar4 = *(undefined8 *)(bytes + 0x45);
    *(undefined8 *)(key_out->pub_key + 0x10) = *(undefined8 *)(bytes + 0x3d);
    *(undefined8 *)(key_out->pub_key + 0x18) = uVar4;
    *(undefined8 *)key_out->pub_key = uVar2;
    *(undefined8 *)(key_out->pub_key + 8) = uVar3;
    key_out->priv_key[0] = '\x01';
    wally_clear(key_out->priv_key + 1,0x20);
LAB_0049df18:
    wally_hash160(key_out->pub_key,0x21,key_out->hash160,0x14);
    return 0;
  }
LAB_0049df74:
  wally_clear(key_out,0xc0);
  return -2;
}

Assistant:

int bip32_key_unserialize(const unsigned char *bytes, size_t bytes_len,
                          struct ext_key *key_out)
{
    if (!bytes || bytes_len != BIP32_SERIALIZED_LEN || !key_out)
        return WALLY_EINVAL;

    wally_clear(key_out, sizeof(*key_out));

    bytes = copy_in(&key_out->version, bytes, sizeof(key_out->version));
    key_out->version = be32_to_cpu(key_out->version);
    if (!version_is_valid(key_out->version, BIP32_FLAG_KEY_PUBLIC))
        return wipe_key_fail(key_out);

    bytes = copy_in(&key_out->depth, bytes, sizeof(key_out->depth));

    /* We only have a partial fingerprint available. Copy it, but the
     * user will need to call bip32_key_set_parent() (FIXME: Implement)
     * later if they want it to be fully populated.
     */
    bytes = copy_in(key_out->parent160, bytes, BIP32_KEY_FINGERPRINT_LEN);
    bytes = copy_in(&key_out->child_num, bytes, sizeof(key_out->child_num));
    key_out->child_num = be32_to_cpu(key_out->child_num);
    bytes = copy_in(key_out->chain_code, bytes, sizeof(key_out->chain_code));

    if (bytes[0] == BIP32_FLAG_KEY_PRIVATE) {
        if (key_out->version == BIP32_VER_MAIN_PUBLIC ||
            key_out->version == BIP32_VER_TEST_PUBLIC)
            return wipe_key_fail(key_out); /* Private key data in public key */

        copy_in(key_out->priv_key, bytes, sizeof(key_out->priv_key));
        if (key_compute_pub_key(key_out) != WALLY_OK)
            return wipe_key_fail(key_out);
    } else {
        if (key_out->version == BIP32_VER_MAIN_PRIVATE ||
            key_out->version == BIP32_VER_TEST_PRIVATE)
            return wipe_key_fail(key_out); /* Public key data in private key */

        copy_in(key_out->pub_key, bytes, sizeof(key_out->pub_key));
        bip32_key_strip_private_key(key_out);
    }

    key_compute_hash160(key_out);
    return WALLY_OK;
}